

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceStub
          (Generator *this,ServiceDescriptor *descriptor)

{
  Printer *this_00;
  string local_60;
  string local_40;
  
  io::Printer::Print(this->printer_,"class $class_name$_Stub($class_name$):\n","class_name",
                     *(string **)descriptor);
  io::Printer::Indent(this->printer_);
  this_00 = this->printer_;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"DESCRIPTOR","");
  ModuleLevelServiceDescriptorName_abi_cxx11_(&local_40,this,descriptor);
  io::Printer::Print(this_00,
                     "__metaclass__ = service_reflection.GeneratedServiceStubType\n$descriptor_key$ = $descriptor_name$\n"
                     ,"descriptor_key",&local_60,"descriptor_name",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Outdent(this->printer_);
  return;
}

Assistant:

void Generator::PrintServiceStub(const ServiceDescriptor& descriptor) const {
  // Print the service stub.
  printer_->Print("class $class_name$_Stub($class_name$):\n",
                  "class_name", descriptor.name());
  printer_->Indent();
  printer_->Print(
      "__metaclass__ = service_reflection.GeneratedServiceStubType\n"
      "$descriptor_key$ = $descriptor_name$\n",
      "descriptor_key", kDescriptorKey,
      "descriptor_name", ModuleLevelServiceDescriptorName(descriptor));
  printer_->Outdent();
}